

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

string * __thiscall
cmGeneratorTarget::GetPchFile
          (string *__return_storage_ptr__,cmGeneratorTarget *this,string *config,string *language,
          string *arch)

{
  _Base_ptr this_00;
  cmMakefile *pcVar1;
  bool bVar2;
  string *psVar3;
  cmValue name;
  long lVar4;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_bool>
  pVar5;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>
  local_c8;
  string pchExtension;
  string pchFileObject;
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40 [16];
  
  std::operator+(&pchFileObject,language,config);
  std::operator+(&pchExtension,&pchFileObject,arch);
  local_c8.first._M_string_length = pchExtension._M_string_length;
  local_c8.first._M_dataplus._M_p = (pointer)&local_c8.first.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pchExtension._M_dataplus._M_p == &pchExtension.field_2) {
    local_c8.first.field_2._8_8_ = pchExtension.field_2._8_8_;
  }
  else {
    local_c8.first._M_dataplus._M_p = pchExtension._M_dataplus._M_p;
  }
  pchExtension._M_string_length = 0;
  pchExtension.field_2._M_local_buf[0] = '\0';
  local_c8.second = "";
  pchExtension._M_dataplus._M_p = (pointer)&pchExtension.field_2;
  pVar5 = std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
          ::_M_emplace_unique<std::pair<std::__cxx11::string,char_const*>>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                      *)&this->PchFiles,&local_c8);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)&pchExtension);
  std::__cxx11::string::~string((string *)&pchFileObject);
  if (((undefined1  [16])pVar5 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    pcVar1 = this->Makefile;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c8,"CMAKE_PCH_EXTENSION",(allocator<char> *)&pchFileObject);
    psVar3 = cmMakefile::GetSafeDefinition(pcVar1,&local_c8.first);
    std::__cxx11::string::string((string *)&pchExtension,(string *)psVar3);
    std::__cxx11::string::~string((string *)&local_c8);
    pcVar1 = this->Makefile;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c8,"CMAKE_LINK_PCH",(allocator<char> *)&pchFileObject);
    bVar2 = cmMakefile::IsOn(pcVar1,&local_c8.first);
    this_00 = pVar5.first._M_node._M_node + 2;
    std::__cxx11::string::~string((string *)&local_c8);
    if (bVar2) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_c8,"PRECOMPILE_HEADERS_REUSE_FROM",
                 (allocator<char> *)&pchFileObject);
      name = GetProperty(this,&local_c8.first);
      std::__cxx11::string::~string((string *)&local_c8);
      if (name.Value != (string *)0x0) {
        this = cmGlobalGenerator::FindGeneratorTarget
                         (this->LocalGenerator->GlobalGenerator,name.Value);
      }
      GetPchFileObject(&pchFileObject,this,config,language,arch);
      if (pchExtension._M_string_length != 0) {
        lVar4 = std::__cxx11::string::rfind((char)&pchFileObject,0x2e);
        local_50 = local_40;
        local_48 = 0;
        local_40[0] = 0;
        if (lVar4 != -1) {
          std::__cxx11::string::substr((ulong)&local_c8,(ulong)&pchFileObject);
          std::__cxx11::string::operator=((string *)&local_50,(string *)&local_c8);
          std::__cxx11::string::~string((string *)&local_c8);
        }
        std::__cxx11::string::append((string *)&local_50);
        std::__cxx11::string::operator=((string *)this_00,(string *)&local_50);
        std::__cxx11::string::~string((string *)&local_50);
      }
      std::__cxx11::string::~string((string *)&pchFileObject);
    }
    else {
      GetPchHeader(&local_c8.first,this,config,language,arch);
      std::__cxx11::string::operator=((string *)this_00,(string *)&local_c8);
      std::__cxx11::string::~string((string *)&local_c8);
      std::__cxx11::string::append((string *)this_00);
    }
    std::__cxx11::string::~string((string *)&pchExtension);
  }
  std::__cxx11::string::string
            ((string *)__return_storage_ptr__,(string *)(pVar5.first._M_node._M_node + 2));
  return __return_storage_ptr__;
}

Assistant:

std::string cmGeneratorTarget::GetPchFile(const std::string& config,
                                          const std::string& language,
                                          const std::string& arch)
{
  const auto inserted =
    this->PchFiles.insert(std::make_pair(language + config + arch, ""));
  if (inserted.second) {
    std::string& pchFile = inserted.first->second;

    const std::string pchExtension =
      this->Makefile->GetSafeDefinition("CMAKE_PCH_EXTENSION");

    if (this->Makefile->IsOn("CMAKE_LINK_PCH")) {
      auto replaceExtension = [](const std::string& str,
                                 const std::string& ext) -> std::string {
        auto dot_pos = str.rfind('.');
        std::string result;
        if (dot_pos != std::string::npos) {
          result = str.substr(0, dot_pos);
        }
        result += ext;
        return result;
      };

      cmGeneratorTarget* generatorTarget = this;
      cmValue pchReuseFrom =
        generatorTarget->GetProperty("PRECOMPILE_HEADERS_REUSE_FROM");
      if (pchReuseFrom) {
        generatorTarget =
          this->GetGlobalGenerator()->FindGeneratorTarget(*pchReuseFrom);
      }

      const std::string pchFileObject =
        generatorTarget->GetPchFileObject(config, language, arch);
      if (!pchExtension.empty()) {
        pchFile = replaceExtension(pchFileObject, pchExtension);
      }
    } else {
      pchFile = this->GetPchHeader(config, language, arch);
      pchFile += pchExtension;
    }
  }
  return inserted.first->second;
}